

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

bool __thiscall Debugger::DoEval(Debugger *this,shared_ptr<EvalContext> *evalContext)

{
  element_type *peVar1;
  ArenaClass *pAVar2;
  dll_lua_getfield p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Debugger *L;
  Variable *pVVar7;
  Debugger *this_00;
  Idx<Variable> variable;
  Idx<Variable> variable_00;
  string statement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  L = (Debugger *)this->currentL;
  if ((L != (Debugger *)0x0) &&
     (peVar1 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar1 != (element_type *)0x0)) {
    iVar6 = peVar1->stackLevel;
    while (L != (Debugger *)0x0) {
      iVar5 = LastLevel((lua_State *)L);
      if (iVar6 - iVar5 == 0 || iVar6 < iVar5) {
        if (0 < ((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->cacheId) {
          (*lua_getfield)((lua_State *)L,LUA_REGISTRYINDEX,"_emmy_cache_table_");
          iVar5 = (*lua_type)((lua_State *)L,-1);
          p_Var3 = lua_getfield;
          if (iVar5 == 5) {
            std::__cxx11::to_string
                      (&statement,
                       ((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->cacheId);
            (*p_Var3)((lua_State *)L,-1,statement._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&statement);
            peVar1 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            pAVar2 = (peVar1->result)._arena;
            this->arenaRef = pAVar2;
            variable._4_4_ = 0;
            variable.Raw = (peVar1->result).Raw;
            variable._arena = pAVar2;
            GetVariable(this,(lua_State *)L,variable,-1,peVar1->depth,true);
            this->arenaRef = (Arena<Variable> *)0x0;
            (*lua_settop)((lua_State *)L,-3);
            return true;
          }
          (*lua_settop)((lua_State *)L,-2);
        }
        std::__cxx11::string::string((string *)&statement,"return ",(allocator *)&local_50);
        peVar1 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar1->setValue == true) {
          std::operator+(&local_b0,&peVar1->expr," = ");
          std::operator+(&local_90,&local_b0,
                         &((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->value);
          std::operator+(&local_70,&local_90," return ");
          std::operator+(&local_50,&local_70,
                         &((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->expr);
          std::__cxx11::string::operator=((string *)&statement,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          std::__cxx11::string::append((string *)&statement);
        }
        iVar5 = (*luaL_loadstring)((lua_State *)L,statement._M_dataplus._M_p);
        if (iVar5 == 3) {
          std::__cxx11::string::assign
                    ((char *)&((evalContext->
                               super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                              ->error);
          std::__cxx11::string::append
                    ((string *)
                     &((evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->error);
        }
        else {
          this_00 = L;
          iVar5 = (*lua_gettop)((lua_State *)L);
          bVar4 = CreateEnv(this_00,(lua_State *)L,iVar6);
          if (bVar4) {
            lua_setfenv((lua_State *)L,iVar5);
            iVar6 = (*lua_gettop)((lua_State *)L);
            if (iVar6 != iVar5) {
              __assert_fail("lua_gettop(L) == fIdx",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                            ,0x3d4,"bool Debugger::DoEval(std::shared_ptr<EvalContext>)");
            }
            iVar6 = lua_pcall((lua_State *)L,0,1,0);
            if (iVar6 == 2) {
              (*lua_tolstring)((lua_State *)L,-1,(size_t *)0x0);
              std::__cxx11::string::assign
                        ((char *)&((evalContext->
                                   super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr)->error);
            }
            else if (iVar6 == 0) {
              pVVar7 = Idx<Variable>::operator->
                                 (&((evalContext->
                                    super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->result);
              std::__cxx11::string::_M_assign((string *)&pVVar7->name);
              peVar1 = (evalContext->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              pAVar2 = (peVar1->result)._arena;
              this->arenaRef = pAVar2;
              variable_00._4_4_ = 0;
              variable_00.Raw = (peVar1->result).Raw;
              variable_00._arena = pAVar2;
              GetVariable(this,(lua_State *)L,variable_00,-1,peVar1->depth,true);
              this->arenaRef = (Arena<Variable> *)0x0;
              bVar4 = true;
              (*lua_settop)((lua_State *)L,-2);
              goto LAB_00157553;
            }
            (*lua_settop)((lua_State *)L,-2);
          }
        }
        bVar4 = false;
LAB_00157553:
        std::__cxx11::string::~string((string *)&statement);
        return bVar4;
      }
      L = (Debugger *)ExtensionPoint::QueryParentThread(&this->manager->extension,(lua_State *)L);
      iVar6 = iVar6 - iVar5;
    }
  }
  return false;
}

Assistant:

bool Debugger::DoEval(std::shared_ptr<EvalContext> evalContext) {
	if (!currentL || !evalContext) {
		return false;
	}

	auto L = currentL;

	int innerLevel = evalContext->stackLevel;

	while (L != nullptr) {
		int level = LastLevel(L);
		if (innerLevel > level) {
			innerLevel -= level;
			L = manager->extension.QueryParentThread(L);
		} else {
			break;
		}
	}

	if (L == nullptr) {
		return false;
	}

	//auto* const L = L;
	// From "cacheId"
	if (evalContext->cacheId > 0) {
		lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable|nil
		if (lua_type(L, -1) == LUA_TTABLE) {
			lua_getfield(L, -1, std::to_string(evalContext->cacheId).c_str());// 1: cacheTable, 2: value
			SetVariableArena(evalContext->result.GetArena());
			GetVariable(L, evalContext->result, -1, evalContext->depth);
			ClearVariableArenaRef();
			lua_pop(L, 2);
			return true;
		}
		lua_pop(L, 1);
	}
	// LOAD AS "return expr"
	std::string statement = "return ";
	if (evalContext->setValue) {
		statement = evalContext->expr + " = " + evalContext->value + " return " + evalContext->expr;
	} else {
		statement.append(evalContext->expr);
	}

	// 如果是 aaa:bbbb 则纠正为aaa.bbbb
	int r = luaL_loadstring(L, statement.c_str());
	if (r == LUA_ERRSYNTAX) {
		evalContext->error = "syntax err: ";
		evalContext->error.append(evalContext->expr);
		return false;
	}
	// call
	const int fIdx = lua_gettop(L);
	// create env
	if (!CreateEnv(L, innerLevel))
		return false;
	// setup env
#ifndef EMMY_USE_LUA_SOURCE
	lua_setfenv(L, fIdx);
#elif defined(EMMY_LUA_51) || defined(EMMY_LUA_JIT)
    lua_setfenv(L, fIdx);
#else //52 & 53
    lua_setupvalue(L, fIdx, 1);
#endif
	assert(lua_gettop(L) == fIdx);
	// call function() return expr end
	r = lua_pcall(L, 0, 1, 0);
	if (r == LUA_OK) {
		evalContext->result->name = evalContext->expr;
		SetVariableArena(evalContext->result.GetArena());
		GetVariable(L, evalContext->result, -1, evalContext->depth);
		ClearVariableArenaRef();
		lua_pop(L, 1);
		return true;
	}
	if (r == LUA_ERRRUN) {
		evalContext->error = lua_tostring(L, -1);
	}

	lua_pop(L, 1);
	return false;
}